

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddMissingProperty
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SValue *name)

{
  CrtAllocator *pCVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_20;
  
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericValue<rapidjson::CrtAllocator>(&local_20,name,pCVar1,false);
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
            (&this->currentError_,&local_20,pCVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_20);
  return;
}

Assistant:

void AddMissingProperty(const SValue& name) {
        currentError_.PushBack(ValueType(name, GetStateAllocator()).Move(), GetStateAllocator());
    }